

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  byte bVar1;
  long *plVar2;
  int iVar3;
  archive_read_filter *__n;
  long lVar4;
  byte *pbVar5;
  long *in_RSI;
  long in_RDI;
  int n_1;
  int n;
  int64_t body;
  int64_t l;
  ssize_t nl;
  ssize_t llen;
  ssize_t len;
  ssize_t total;
  ssize_t used;
  ssize_t ravail;
  ssize_t avail_in;
  uchar *out;
  uchar *d;
  uchar *b;
  uudecode *uudecode;
  ulong in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uudecode *in_stack_ffffffffffffff80;
  archive_read_filter *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  archive_read_filter *in_stack_ffffffffffffff98;
  archive_read_filter *paVar6;
  long local_58;
  long local_50;
  size_t local_40;
  undefined1 *local_38;
  byte *local_30;
  byte *local_28;
  
  plVar2 = *(long **)(in_RDI + 0x50);
  while( true ) {
    local_30 = (byte *)__archive_read_filter_ahead
                                 (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                  &in_stack_ffffffffffffff88->position);
    if ((local_30 == (byte *)0x0) && ((long)local_40 < 0)) {
      return -0x1e;
    }
    if (local_30 == (byte *)0x0) {
      local_40 = 0;
    }
    local_50 = 0;
    local_58 = 0;
    local_38 = (undefined1 *)plVar2[4];
    if ((int)plVar2[5] == 4) break;
    if ((int)plVar2[2] != 0) {
      iVar3 = ensure_in_buff_size(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (iVar3 != 0) {
        return -0x1e;
      }
      memcpy((void *)(plVar2[1] + (long)(int)plVar2[2]),local_30,local_40);
      local_30 = (byte *)plVar2[1];
      local_40 = (long)(int)plVar2[2] + local_40;
      *(undefined4 *)(plVar2 + 2) = 0;
    }
    while( true ) {
      if ((long)local_40 <= local_50) goto LAB_0012f170;
      local_28 = local_30;
      __n = (archive_read_filter *)
            get_line(local_30,local_40 - local_50,(ssize_t *)&stack0xffffffffffffff90);
      if ((long)__n < 0) {
        if (((int)plVar2[5] != 0) || ((*plVar2 < 1 && (local_58 < 1)))) {
          archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Insufficient compressed data");
          return -0x1e;
        }
        *(undefined4 *)(plVar2 + 5) = 4;
        goto LAB_0012f170;
      }
      if (in_stack_ffffffffffffff90 == 0) break;
      in_stack_ffffffffffffff70 = (ulong)*(uint *)(plVar2 + 5);
      paVar6 = __n;
      switch(in_stack_ffffffffffffff70) {
      default:
        if (0x1ffff < (long)&__n->position + local_58) {
          archive_set_error(*(archive **)(in_RDI + 0x18),0x54,"Invalid format data");
          return -0x1e;
        }
        if (((long)((long)__n - in_stack_ffffffffffffff90) < 0xb) ||
           (iVar3 = memcmp(local_30,"begin ",6), iVar3 != 0)) {
          if (((long)((long)__n - in_stack_ffffffffffffff90) < 0x12) ||
             (iVar3 = memcmp(local_30,"begin-base64 ",0xd), iVar3 != 0)) {
            in_stack_ffffffffffffff88 = (archive_read_filter *)0x0;
          }
          else {
            in_stack_ffffffffffffff88 = (archive_read_filter *)0xd;
          }
        }
        else {
          in_stack_ffffffffffffff88 = (archive_read_filter *)0x6;
        }
        if ((((in_stack_ffffffffffffff88 != (archive_read_filter *)0x0) &&
             (0x2f < local_30[(long)in_stack_ffffffffffffff88])) &&
            (local_30[(long)in_stack_ffffffffffffff88] < 0x38)) &&
           (((0x2f < (local_30 + 1)[(long)in_stack_ffffffffffffff88] &&
             ((local_30 + 1)[(long)in_stack_ffffffffffffff88] < 0x38)) &&
            ((0x2f < (local_30 + 2)[(long)in_stack_ffffffffffffff88] &&
             (((local_30 + 2)[(long)in_stack_ffffffffffffff88] < 0x38 &&
              ((local_30 + 3)[(long)in_stack_ffffffffffffff88] == 0x20)))))))) {
          if (in_stack_ffffffffffffff88 == (archive_read_filter *)0x6) {
            *(undefined4 *)(plVar2 + 5) = 1;
          }
          else {
            *(undefined4 *)(plVar2 + 5) = 3;
          }
        }
        break;
      case 1:
        if (0x10000 < local_58 + (long)__n * 2) goto LAB_0012f170;
        if ((""[*local_30] == '\0') || ((long)((long)__n - in_stack_ffffffffffffff90) < 1)) {
          archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Insufficient compressed data");
          return -0x1e;
        }
        lVar4 = (long)(int)(*local_30 - 0x20 & 0x3f);
        in_stack_ffffffffffffff80 = (uudecode *)(((long)__n - in_stack_ffffffffffffff90) + -1);
        if ((long)in_stack_ffffffffffffff80 < lVar4) {
          archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Insufficient compressed data");
          return -0x1e;
        }
        local_28 = local_30 + 1;
        if (lVar4 == 0) {
          *(undefined4 *)(plVar2 + 5) = 2;
          in_stack_ffffffffffffff88 = (archive_read_filter *)0x0;
        }
        else {
          while (0 < lVar4) {
            in_stack_ffffffffffffff7c = 0;
            if (0 < lVar4) {
              if ((""[*local_28] == '\0') || (""[local_28[1]] == '\0')) break;
              pbVar5 = local_28 + 1;
              bVar1 = *local_28;
              local_28 = local_28 + 2;
              in_stack_ffffffffffffff7c =
                   (*pbVar5 - 0x20 & 0x3f) << 0xc | (bVar1 - 0x20 & 0x3f) << 0x12;
              *local_38 = (char)(in_stack_ffffffffffffff7c >> 0x10);
              local_58 = local_58 + 1;
              lVar4 = lVar4 + -1;
              local_38 = local_38 + 1;
            }
            if (0 < lVar4) {
              if (""[*local_28] == '\0') break;
              in_stack_ffffffffffffff7c = (*local_28 - 0x20 & 0x3f) << 6 | in_stack_ffffffffffffff7c
              ;
              *local_38 = (char)(in_stack_ffffffffffffff7c >> 8);
              local_58 = local_58 + 1;
              lVar4 = lVar4 + -1;
              local_38 = local_38 + 1;
              local_28 = local_28 + 1;
            }
            if (0 < lVar4) {
              if (""[*local_28] == '\0') break;
              in_stack_ffffffffffffff7c = *local_28 - 0x20 & 0x3f | in_stack_ffffffffffffff7c;
              *local_38 = (char)in_stack_ffffffffffffff7c;
              local_58 = local_58 + 1;
              lVar4 = lVar4 + -1;
              local_38 = local_38 + 1;
              local_28 = local_28 + 1;
            }
          }
          if (lVar4 != 0) {
            archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Insufficient compressed data");
            return -0x1e;
          }
          in_stack_ffffffffffffff88 = (archive_read_filter *)0x0;
        }
        break;
      case 2:
        if (((long)__n - in_stack_ffffffffffffff90 != 3) ||
           (iVar3 = memcmp(local_30,"end ",3), iVar3 != 0)) {
          archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Insufficient compressed data");
          return -0x1e;
        }
        *(undefined4 *)(plVar2 + 5) = 0;
        paVar6 = __n;
        break;
      case 3:
        if (0x10000 < local_58 + (long)__n * 2) goto LAB_0012f170;
        in_stack_ffffffffffffff88 = (archive_read_filter *)((long)__n - in_stack_ffffffffffffff90);
        if (((((long)in_stack_ffffffffffffff88 < 3) || (*local_30 != 0x3d)) || (local_30[1] != 0x3d)
            ) || (local_30[2] != 0x3d)) {
          while (0 < (long)in_stack_ffffffffffffff88) {
            in_stack_ffffffffffffff78 = 0;
            if (0 < (long)in_stack_ffffffffffffff88) {
              if ((""[*local_28] == '\0') || (""[local_28[1]] == '\0')) break;
              pbVar5 = local_28 + 1;
              bVar1 = *local_28;
              local_28 = local_28 + 2;
              in_stack_ffffffffffffff78 = base64num[*pbVar5] << 0xc | base64num[bVar1] << 0x12;
              *local_38 = (char)(in_stack_ffffffffffffff78 >> 0x10);
              local_58 = local_58 + 1;
              in_stack_ffffffffffffff88 =
                   (archive_read_filter *)&in_stack_ffffffffffffff88[-1].field_0xae;
              local_38 = local_38 + 1;
            }
            if (0 < (long)in_stack_ffffffffffffff88) {
              if ((*local_28 == 0x3d) || (""[*local_28] == '\0')) break;
              in_stack_ffffffffffffff78 = base64num[*local_28] << 6 | in_stack_ffffffffffffff78;
              *local_38 = (char)(in_stack_ffffffffffffff78 >> 8);
              local_58 = local_58 + 1;
              in_stack_ffffffffffffff88 =
                   (archive_read_filter *)&in_stack_ffffffffffffff88[-1].field_0xaf;
              local_38 = local_38 + 1;
              local_28 = local_28 + 1;
            }
            if (0 < (long)in_stack_ffffffffffffff88) {
              if ((*local_28 == 0x3d) || (""[*local_28] == '\0')) break;
              in_stack_ffffffffffffff78 = base64num[*local_28] | in_stack_ffffffffffffff78;
              *local_38 = (char)in_stack_ffffffffffffff78;
              local_58 = local_58 + 1;
              in_stack_ffffffffffffff88 =
                   (archive_read_filter *)&in_stack_ffffffffffffff88[-1].field_0xaf;
              local_38 = local_38 + 1;
              local_28 = local_28 + 1;
            }
          }
          if ((in_stack_ffffffffffffff88 != (archive_read_filter *)0x0) && (*local_28 != 0x3d)) {
            archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Insufficient compressed data");
            return -0x1e;
          }
        }
        else {
          *(undefined4 *)(plVar2 + 5) = 0;
        }
      }
      local_30 = local_30 + (long)&paVar6->position;
      local_50 = (long)&paVar6->position + local_50;
    }
    in_stack_ffffffffffffff98 = __n;
    iVar3 = ensure_in_buff_size(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar3 != 0) {
      return -0x1e;
    }
    if ((byte *)plVar2[1] != local_30) {
      memmove((void *)plVar2[1],local_30,(size_t)__n);
    }
    *(int *)(plVar2 + 2) = (int)__n;
    if (local_58 != 0) break;
    __archive_read_filter_consume
              ((archive_read_filter *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70);
  }
LAB_0012f170:
  __archive_read_filter_consume
            ((archive_read_filter *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  *in_RSI = plVar2[4];
  *plVar2 = local_58 + *plVar2;
  return local_58;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if (nl == 0) {
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of curent line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!uuchar[b[0]] || !uuchar[b[1]])
						break;
					n = UUDECODE(*b++) << 18;
					n |= UUDECODE(*b++) << 12;
					*out++ = n >> 16; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (l > 0) {
					if (!base64[b[0]] || !base64[b[1]])
						break;
					n = base64num[*b++] << 18;
					n |= base64num[*b++] << 12;
					*out++ = n >> 16; total++;
					l -= 2;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}